

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::StringMaker<char[27],void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char[27],void> *this,char *str)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(char *)this,&local_31);
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(char const* str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }